

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadClass.cpp
# Opt level: O3

void __thiscall
sznet::detail::ThreadNameInitializer::ThreadNameInitializer(ThreadNameInitializer *this)

{
  int *in_FS_OFFSET;
  
  this->m_mainPid = 0;
  sznet::CurrentThread::t_threadName::__tls_init();
  *(char **)in_FS_OFFSET = "main";
  sznet::CurrentThread::t_cachedTid::__tls_init();
  if (*in_FS_OFFSET == 0) {
    CurrentThread::cacheTid();
  }
  sznet::CurrentThread::t_cachedTid::__tls_init();
  this->m_mainPid = *in_FS_OFFSET;
  return;
}

Assistant:

ThreadNameInitializer()
	{
		// 设置主线程名称
		sznet::CurrentThread::t_threadName = "main";
		// 缓存线程id
		m_mainPid = CurrentThread::tid();
	}